

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_not_ppc64
               (TCGContext_conflict10 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  tcg_gen_gvec_2_ppc64(tcg_ctx,dofs,aofs,oprsz,maxsz,&tcg_gen_gvec_not_ppc64::g);
  return;
}

Assistant:

void tcg_gen_gvec_not(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen2 g = {
        .fni8 = tcg_gen_not_i64,
        .fniv = tcg_gen_not_vec,
        .fno = gen_helper_gvec_not,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };
    tcg_gen_gvec_2(tcg_ctx, dofs, aofs, oprsz, maxsz, &g);
}